

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void mark(Object *object)

{
  ObjectType OVar1;
  object_t *poVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  
  if (object->marked == '\0') {
    if (object->type == OBJ_DICT) {
      OVar1 = object[1].type;
      if (OVar1 != OBJ_STRING) {
        uVar4 = 0;
        do {
          puVar5 = *(undefined8 **)(&(object[2].next)->marked + uVar4 * 8);
          if (puVar5 != (undefined8 *)0x0) {
            do {
              mark((Object *)*puVar5);
              if (*(int *)(puVar5 + 2) == 2) {
                mark((Object *)puVar5[3]);
              }
              puVar5 = (undefined8 *)puVar5[4];
            } while (puVar5 != (undefined8 *)0x0);
            OVar1 = object[1].type;
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < OVar1);
      }
    }
    else if ((object->type == OBJ_LIST) && (poVar2 = object[1].next, poVar2 != (object_t *)0x0)) {
      lVar3 = 8;
      uVar4 = 0;
      do {
        if (*(int *)(*(long *)(object + 2) + -8 + lVar3) == 2) {
          mark(*(Object **)(*(long *)(object + 2) + lVar3));
          poVar2 = object[1].next;
        }
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < poVar2);
    }
    object->marked = '\x01';
    return;
  }
  return;
}

Assistant:

static void mark(Object *object) {
    if (object->marked) { return; }

    if (object->type == OBJ_DICT) {
        ObjDict *dict = (ObjDict *) object;

        for (int i = 0; i < dict->content.cap; ++i) {
            HTItem *current = dict->content.buckets[i];

            while (current) {
                mark((Object *) current->key.key_obj_string);

                if (current->value.type == OBJECT) {
                    mark(current->value.o_value);
                }

                current = current->next;
            }
        }

    } else if (object->type == OBJ_LIST) {
        ObjList *list = (ObjList *) object;

        for (int i = 0; i < list->content.count; ++i) {
            CrispyValue *current = &list->content.values[i];

            if (current->type == OBJECT) {
                mark(current->o_value);
            }
        }
    }

    object->marked = 1;
}